

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O1

void __thiscall
Diligent::PipelineResourceSignatureDescWrapper::SetCombinedSamplerSuffix
          (PipelineResourceSignatureDescWrapper *this,char *Suffix)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  char (*in_RCX) [18];
  char *Suffix_local;
  string msg;
  
  Suffix_local = Suffix;
  if (Suffix == (char *)0x0) {
    FormatString<char[26],char[18]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x91c4c7,in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SetCombinedSamplerSuffix",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
               ,0x107);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar2 = Suffix_local;
  if ((this->m_Desc).UseCombinedTextureSamplers == true) {
    iVar3 = strcmp((this->m_Desc).CombinedSamplerSuffix,Suffix_local);
    if (iVar3 != 0) {
      LogError<true,char[30],char_const*,char[38],char_const*,char[110]>
                (false,"SetCombinedSamplerSuffix",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
                 ,0x10d,(char (*) [30])"New Combined Sampler Suffix (",&Suffix_local,
                 (char (*) [38])") does not match the current suffix (",
                 &(this->m_Desc).CombinedSamplerSuffix,
                 (char (*) [110])
                 "). This indicates that the pipeline state uses shaders with different sampler suffixes, which is not allowed."
                );
    }
  }
  else {
    pcVar1 = (char *)(this->m_CombinedSamplerSuffix)._M_string_length;
    strlen(Suffix_local);
    std::__cxx11::string::_M_replace((ulong)&this->m_CombinedSamplerSuffix,0,pcVar1,(ulong)pcVar2);
    (this->m_Desc).CombinedSamplerSuffix = (this->m_CombinedSamplerSuffix)._M_dataplus._M_p;
    (this->m_Desc).UseCombinedTextureSamplers = true;
  }
  return;
}

Assistant:

void SetCombinedSamplerSuffix(const char* Suffix)
    {
        VERIFY_EXPR(Suffix != nullptr);
        if (m_Desc.UseCombinedTextureSamplers)
        {
            if (strcmp(m_Desc.CombinedSamplerSuffix, Suffix) != 0)
            {
                LOG_ERROR_AND_THROW("New Combined Sampler Suffix (", Suffix, ") does not match the current suffix (", m_Desc.CombinedSamplerSuffix,
                                    "). This indicates that the pipeline state uses shaders with different sampler suffixes, which is not allowed.");
            }
        }
        else
        {
            m_CombinedSamplerSuffix           = Suffix;
            m_Desc.CombinedSamplerSuffix      = m_CombinedSamplerSuffix.c_str();
            m_Desc.UseCombinedTextureSamplers = true;
        }
    }